

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

uint32_t elf_crc32_file(backtrace_state *state,int descriptor,
                       backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  int *piVar2;
  undefined1 auStack_d8 [4];
  uint32_t ret;
  backtrace_view file_view;
  stat st;
  void *data_local;
  backtrace_error_callback error_callback_local;
  int descriptor_local;
  backtrace_state *state_local;
  
  iVar1 = fstat(descriptor,(stat *)&file_view.len);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    (*error_callback)(data,"fstat",*piVar2);
    state_local._4_4_ = 0;
  }
  else {
    iVar1 = tcmalloc_backtrace_get_view
                      (state,descriptor,0,st.st_rdev,error_callback,data,
                       (backtrace_view *)auStack_d8);
    if (iVar1 == 0) {
      state_local._4_4_ = 0;
    }
    else {
      state_local._4_4_ = elf_crc32(0,_auStack_d8,st.st_rdev);
      tcmalloc_backtrace_release_view(state,(backtrace_view *)auStack_d8,error_callback,data);
    }
  }
  return state_local._4_4_;
}

Assistant:

static uint32_t
elf_crc32_file (struct backtrace_state *state, int descriptor,
		backtrace_error_callback error_callback, void *data)
{
  struct stat st;
  struct backtrace_view file_view;
  uint32_t ret;

  if (fstat (descriptor, &st) < 0)
    {
      error_callback (data, "fstat", errno);
      return 0;
    }

  if (!backtrace_get_view (state, descriptor, 0, st.st_size, error_callback,
			   data, &file_view))
    return 0;

  ret = elf_crc32 (0, (const unsigned char *) file_view.data, st.st_size);

  backtrace_release_view (state, &file_view, error_callback, data);

  return ret;
}